

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_filter_compress.c
# Opt level: O0

int compress_bidder_bid(archive_read_filter_bidder *self,archive_read_filter *filter)

{
  char *pcVar1;
  ssize_t *in_RSI;
  size_t in_RDI;
  int bits_checked;
  ssize_t avail;
  uchar *buffer;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  int iVar2;
  
  pcVar1 = (char *)__archive_read_filter_ahead
                             ((archive_read_filter *)
                              CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),in_RDI,
                              in_RSI);
  if (pcVar1 == (char *)0x0) {
    iVar2 = 0;
  }
  else if ((*pcVar1 == '\x1f') && (pcVar1[1] == -99)) {
    iVar2 = 0x10;
  }
  else {
    iVar2 = 0;
  }
  return iVar2;
}

Assistant:

static int
compress_bidder_bid(struct archive_read_filter_bidder *self,
    struct archive_read_filter *filter)
{
	const unsigned char *buffer;
	ssize_t avail;
	int bits_checked;

	(void)self; /* UNUSED */

	buffer = __archive_read_filter_ahead(filter, 2, &avail);

	if (buffer == NULL)
		return (0);

	bits_checked = 0;
	if (buffer[0] != 0x1F || buffer[1] != 0x9D)
		return (0);
	bits_checked += 16;

	/*
	 * TODO: Verify more.
	 */

	return (bits_checked);
}